

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestProtocols.h
# Opt level: O2

void __thiscall B::B(B *this,ostream *outStream)

{
  (this->super_StreamWriter).stream = outStream;
  FooBarProtocol::FooBarProtocol(&this->super_FooBarProtocol);
  TicTacProtocol::TicTacProtocol(&this->super_TicTacProtocol);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_00160df0;
  (this->super_TicTacProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_00160e28;
  return;
}

Assistant:

B(std::ostream& outStream) :
    StreamWriter(outStream) {}